

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  mapped_type *this_00;
  string *psVar5;
  undefined8 uVar6;
  ostream *poVar7;
  bool local_8c9;
  string local_888;
  byte local_862;
  allocator<char> local_861;
  string local_860 [32];
  undefined1 local_840 [8];
  ostringstream message;
  allocator<char> local_6c1;
  string local_6c0;
  string *local_6a0;
  string *dir;
  string oldcwd;
  string currentcwd;
  string local_650;
  string *local_630;
  string *oldDir;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  string *local_5b0;
  string *cminor;
  uint v;
  string *local_580;
  string *cmajor;
  undefined1 local_558 [8];
  ostringstream error;
  allocator<char> local_3d9;
  string local_3d8;
  _Self local_3b8;
  _Self local_3b0;
  _Self local_3a8;
  _Self local_3a0;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  undefined1 local_348 [8];
  CacheEntry e;
  string helpString;
  undefined1 local_2b8 [4];
  uint lineno;
  string entryKey;
  string buffer;
  char *realbuffer;
  ifstream fin;
  undefined1 local_58 [8];
  string cacheFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *excludes_local;
  bool internal_local;
  string *path_local;
  cmCacheManager *this_local;
  
  cacheFile.field_2._8_8_ = includes;
  std::__cxx11::string::string((string *)local_58,(string *)path);
  std::__cxx11::string::operator+=((string *)local_58,"/CMakeCache.txt");
  if (internal) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&this->Cache);
  }
  bVar1 = cmsys::SystemTools::FileExists((string *)local_58);
  if (bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&realbuffer,pcVar4,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)(entryKey.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_2b8);
      helpString.field_2._12_4_ = 0;
      while (bVar1 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18))), bVar1)
      {
        std::__cxx11::string::string((string *)&e.Initialized);
        CacheEntry::CacheEntry((CacheEntry *)local_348);
        cmsys::SystemTools::GetLineFromStream
                  ((istream *)&realbuffer,(string *)((long)&entryKey.field_2 + 8),(bool *)0x0,-1);
        helpString.field_2._12_4_ = helpString.field_2._12_4_ + 1;
        buffer.field_2._8_8_ = std::__cxx11::string::c_str();
        while( true ) {
          bVar1 = false;
          if ((((*(char *)buffer.field_2._8_8_ != '0') &&
               (bVar1 = true, *(char *)buffer.field_2._8_8_ != ' ')) &&
              (bVar1 = true, *(char *)buffer.field_2._8_8_ != '\t')) &&
             (bVar1 = true, *(char *)buffer.field_2._8_8_ != '\r')) {
            bVar1 = *(char *)buffer.field_2._8_8_ == '\n';
          }
          if (!bVar1) break;
          if (*(char *)buffer.field_2._8_8_ == '\n') {
            helpString.field_2._12_4_ = helpString.field_2._12_4_ + 1;
          }
          buffer.field_2._8_8_ = buffer.field_2._8_8_ + 1;
        }
        if ((*(char *)buffer.field_2._8_8_ != '#') && (*(char *)buffer.field_2._8_8_ != '\0')) {
          while( true ) {
            bVar1 = false;
            if (*(char *)buffer.field_2._8_8_ == '/') {
              bVar1 = *(char *)(buffer.field_2._8_8_ + 1) == '/';
            }
            if (!bVar1) break;
            if ((*(char *)(buffer.field_2._8_8_ + 2) == '\\') &&
               (*(char *)(buffer.field_2._8_8_ + 3) == 'n')) {
              std::__cxx11::string::operator+=((string *)&e.Initialized,"\n");
              std::__cxx11::string::operator+=
                        ((string *)&e.Initialized,(char *)(buffer.field_2._8_8_ + 4));
            }
            else {
              std::__cxx11::string::operator+=
                        ((string *)&e.Initialized,(char *)(buffer.field_2._8_8_ + 2));
            }
            cmsys::SystemTools::GetLineFromStream
                      ((istream *)&realbuffer,(string *)((long)&entryKey.field_2 + 8),(bool *)0x0,-1
                      );
            helpString.field_2._12_4_ = helpString.field_2._12_4_ + 1;
            buffer.field_2._8_8_ = std::__cxx11::string::c_str();
            std::ios::operator!((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18)));
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_368,"HELPSTRING",&local_369);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          CacheEntry::SetProperty((CacheEntry *)local_348,&local_368,pcVar4);
          std::__cxx11::string::~string((string *)&local_368);
          std::allocator<char>::~allocator(&local_369);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,(char *)buffer.field_2._8_8_,&local_391);
          bVar1 = cmState::ParseCacheEntry
                            (&local_390,(string *)local_2b8,(string *)local_348,
                             (CacheEntryType *)(e.Value.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_390);
          std::allocator<char>::~allocator(&local_391);
          if (bVar1) {
            local_3a0._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(excludes,(key_type *)local_2b8);
            local_3a8._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(excludes);
            bVar1 = std::operator==(&local_3a0,&local_3a8);
            if (bVar1) {
              local_8c9 = true;
              if ((!internal) && (local_8c9 = true, e.Value.field_2._8_4_ == 4)) {
                local_3b0._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)cacheFile.field_2._8_8_,(key_type *)local_2b8);
                local_3b8._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)cacheFile.field_2._8_8_);
                local_8c9 = std::operator!=(&local_3b0,&local_3b8);
              }
              if (local_8c9 != false) {
                if (!internal) {
                  e.Value.field_2._8_4_ = 4;
                  std::__cxx11::string::operator=((string *)&e.Initialized,"DO NOT EDIT, ");
                  std::__cxx11::string::operator+=((string *)&e.Initialized,(string *)local_2b8);
                  std::__cxx11::string::operator+=
                            ((string *)&e.Initialized,
                             " loaded from external file.  To change this value edit this file: ");
                  std::__cxx11::string::operator+=((string *)&e.Initialized,(string *)path);
                  std::__cxx11::string::operator+=((string *)&e.Initialized,"/CMakeCache.txt");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3d8,"HELPSTRING",&local_3d9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  CacheEntry::SetProperty((CacheEntry *)local_348,&local_3d8,pcVar4);
                  std::__cxx11::string::~string((string *)&local_3d8);
                  std::allocator<char>::~allocator(&local_3d9);
                }
                bVar1 = ReadPropertyEntry(this,(string *)local_2b8,(CacheEntry *)local_348);
                if (!bVar1) {
                  e.Properties.Map_._M_h._M_single_bucket._0_1_ = 1;
                  this_00 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                            ::operator[](&this->Cache,(key_type *)local_2b8);
                  CacheEntry::operator=(this_00,(CacheEntry *)local_348);
                }
              }
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_558);
            poVar7 = std::operator<<((ostream *)local_558,"Parse error in cache file ");
            std::operator<<(poVar7,(string *)local_58);
            poVar7 = std::operator<<((ostream *)local_558," on line ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,helpString.field_2._12_4_);
            poVar7 = std::operator<<(poVar7,". Offending entry: ");
            std::operator<<(poVar7,(char *)buffer.field_2._8_8_);
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error((string *)&cmajor);
            std::__cxx11::string::~string((string *)&cmajor);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_558);
          }
        }
        CacheEntry::~CacheEntry((CacheEntry *)local_348);
        std::__cxx11::string::~string((string *)&e.Initialized);
      }
      this->CacheMajorVersion = 0;
      this->CacheMinorVersion = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&v,"CMAKE_CACHE_MAJOR_VERSION",(allocator<char> *)((long)&cminor + 7));
      psVar5 = GetInitializedCacheValue(this,(string *)&v);
      std::__cxx11::string::~string((string *)&v);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cminor + 7));
      local_580 = psVar5;
      if (psVar5 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5f8,"CMAKE_CACHE_MINOR_VERSION",&local_5f9);
        AddCacheEntry(this,&local_5f8,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::allocator<char>::~allocator(&local_5f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_620,"CMAKE_CACHE_MAJOR_VERSION",
                   (allocator<char> *)((long)&oldDir + 7));
        AddCacheEntry(this,&local_620,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&local_620);
        std::allocator<char>::~allocator((allocator<char> *)((long)&oldDir + 7));
      }
      else {
        cminor._0_4_ = 0;
        uVar6 = std::__cxx11::string::c_str();
        iVar3 = __isoc99_sscanf(uVar6,"%u",&cminor);
        if (iVar3 == 1) {
          this->CacheMajorVersion = (uint)cminor;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5d0,"CMAKE_CACHE_MINOR_VERSION",&local_5d1);
        psVar5 = GetInitializedCacheValue(this,&local_5d0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::allocator<char>::~allocator(&local_5d1);
        local_5b0 = psVar5;
        if (psVar5 != (string *)0x0) {
          uVar6 = std::__cxx11::string::c_str();
          iVar3 = __isoc99_sscanf(uVar6,"%u",&cminor);
          if (iVar3 == 1) {
            this->CacheMinorVersion = (uint)cminor;
          }
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,"CMAKE_CACHEFILE_DIR",
                 (allocator<char> *)(currentcwd.field_2._M_local_buf + 0xf));
      psVar5 = GetInitializedCacheValue(this,&local_650);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator((allocator<char> *)(currentcwd.field_2._M_local_buf + 0xf));
      local_630 = psVar5;
      if ((internal) && (psVar5 != (string *)0x0)) {
        std::__cxx11::string::string((string *)(oldcwd.field_2._M_local_buf + 8),(string *)path);
        std::__cxx11::string::string((string *)&dir,(string *)local_630);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&oldcwd.field_2 + 8));
        std::__cxx11::string::operator+=
                  ((string *)(oldcwd.field_2._M_local_buf + 8),"/CMakeCache.txt");
        std::__cxx11::string::operator+=((string *)&dir,"/CMakeCache.txt");
        bVar1 = cmsys::SystemTools::SameFile((string *)&dir,(string *)((long)&oldcwd.field_2 + 8));
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6c0,"CMAKE_CACHEFILE_DIR",&local_6c1);
          psVar5 = GetInitializedCacheValue(this,&local_6c0);
          std::__cxx11::string::~string((string *)&local_6c0);
          std::allocator<char>::~allocator(&local_6c1);
          local_6a0 = psVar5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_840);
          poVar7 = std::operator<<((ostream *)local_840,"The current CMakeCache.txt directory ");
          poVar7 = std::operator<<(poVar7,(string *)(oldcwd.field_2._M_local_buf + 8));
          poVar7 = std::operator<<(poVar7," is different than the directory ");
          local_862 = 0;
          if (local_6a0 == (string *)0x0) {
            std::allocator<char>::allocator();
            local_862 = 1;
            std::__cxx11::string::string<std::allocator<char>>(local_860,"",&local_861);
          }
          else {
            std::__cxx11::string::string(local_860,(string *)local_6a0);
          }
          poVar7 = std::operator<<(poVar7,local_860);
          std::operator<<(poVar7,
                          " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                         );
          std::__cxx11::string::~string(local_860);
          if ((local_862 & 1) != 0) {
            std::allocator<char>::~allocator(&local_861);
          }
          std::__cxx11::ostringstream::str();
          cmSystemTools::Error(&local_888);
          std::__cxx11::string::~string((string *)&local_888);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
        }
        std::__cxx11::string::~string((string *)&dir);
        std::__cxx11::string::~string((string *)(oldcwd.field_2._M_local_buf + 8));
      }
      this_local._7_1_ = true;
      std::__cxx11::string::~string((string *)local_2b8);
      std::__cxx11::string::~string((string *)(entryKey.field_2._M_local_buf + 8));
    }
    else {
      this_local._7_1_ = false;
    }
    std::ifstream::~ifstream(&realbuffer);
  }
  else {
    CleanCMakeFiles(this,path);
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path, bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  // clear the old cache, if we are reading in internal values
  if (internal) {
    this->Cache.clear();
  }
  if (!cmSystemTools::FileExists(cacheFile)) {
    this->CleanCMakeFiles(path);
    return false;
  }

  cmsys::ifstream fin(cacheFile.c_str());
  if (!fin) {
    return false;
  }
  const char* realbuffer;
  std::string buffer;
  std::string entryKey;
  unsigned int lineno = 0;
  while (fin) {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    lineno++;
    realbuffer = buffer.c_str();
    while (*realbuffer != '0' &&
           (*realbuffer == ' ' || *realbuffer == '\t' || *realbuffer == '\r' ||
            *realbuffer == '\n')) {
      if (*realbuffer == '\n') {
        lineno++;
      }
      realbuffer++;
    }
    // skip blank lines and comment lines
    if (realbuffer[0] == '#' || realbuffer[0] == 0) {
      continue;
    }
    while (realbuffer[0] == '/' && realbuffer[1] == '/') {
      if ((realbuffer[2] == '\\') && (realbuffer[3] == 'n')) {
        helpString += "\n";
        helpString += &realbuffer[4];
      } else {
        helpString += &realbuffer[2];
      }
      cmSystemTools::GetLineFromStream(fin, buffer);
      lineno++;
      realbuffer = buffer.c_str();
      if (!fin) {
        continue;
      }
    }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if (cmState::ParseCacheEntry(realbuffer, entryKey, e.Value, e.Type)) {
      if (excludes.find(entryKey) == excludes.end()) {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if (internal || (e.Type != cmStateEnums::INTERNAL) ||
            (includes.find(entryKey) != includes.end())) {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal) {
            e.Type = cmStateEnums::INTERNAL;
            helpString = "DO NOT EDIT, ";
            helpString += entryKey;
            helpString += " loaded from external file.  "
                          "To change this value edit this file: ";
            helpString += path;
            helpString += "/CMakeCache.txt";
            e.SetProperty("HELPSTRING", helpString.c_str());
          }
          if (!this->ReadPropertyEntry(entryKey, e)) {
            e.Initialized = true;
            this->Cache[entryKey] = e;
          }
        }
      }
    } else {
      std::ostringstream error;
      error << "Parse error in cache file " << cacheFile;
      error << " on line " << lineno << ". Offending entry: " << realbuffer;
      cmSystemTools::Error(error.str());
    }
  }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if (const std::string* cmajor =
        this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION")) {
    unsigned int v = 0;
    if (sscanf(cmajor->c_str(), "%u", &v) == 1) {
      this->CacheMajorVersion = v;
    }
    if (const std::string* cminor =
          this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION")) {
      if (sscanf(cminor->c_str(), "%u", &v) == 1) {
        this->CacheMinorVersion = v;
      }
    }
  } else {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
  }
  // check to make sure the cache directory has not
  // been moved
  const std::string* oldDir =
    this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir) {
    std::string currentcwd = path;
    std::string oldcwd = *oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if (!cmSystemTools::SameFile(oldcwd, currentcwd)) {
      const std::string* dir =
        this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
      std::ostringstream message;
      message << "The current CMakeCache.txt directory " << currentcwd
              << " is different than the directory " << (dir ? *dir : "")
              << " where CMakeCache.txt was created. This may result "
                 "in binaries being created in the wrong place. If you "
                 "are not sure, reedit the CMakeCache.txt";
      cmSystemTools::Error(message.str());
    }
  }
  return true;
}